

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall Catch::Matchers::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  ulong uVar1;
  ulong uVar2;
  ReusableStringStream RStack_48;
  string local_38;
  SourceLineInfo local_18;
  
  if (this->m_type == Double) {
    if (NAN(*matchee) || NAN(this->m_target)) {
      return false;
    }
    uVar2 = this->m_ulps;
    uVar1 = ulpDistance<double>(*matchee,this->m_target);
  }
  else {
    if (this->m_type != Float) {
      ReusableStringStream::ReusableStringStream(&RStack_48);
      local_18.file =
           "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
      ;
      local_18.line = 0x1fc7;
      operator<<(RStack_48.m_oss,&local_18);
      std::__ostream_insert<char,std::char_traits<char>>
                (RStack_48.m_oss,": Internal Catch2 error: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (RStack_48.m_oss,"Unknown Detail::FloatingPointKind value",0x27);
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_38);
    }
    if (NAN((float)*matchee) || NAN((float)this->m_target)) {
      return false;
    }
    uVar2 = this->m_ulps;
    uVar1 = ulpDistance<float>((float)*matchee,(float)this->m_target);
  }
  return uVar1 <= uVar2;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case Detail::FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case Detail::FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown Detail::FloatingPointKind value" );
        }
    }